

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgmesh.cpp
# Opt level: O2

void __thiscall TPZGeoMesh::PrintTopologicalInfo(TPZGeoMesh *this,ostream *out)

{
  ostream *poVar1;
  TPZGeoNode *this_00;
  TPZGeoEl **ppTVar2;
  long lVar3;
  long lVar4;
  
  poVar1 = std::operator<<(out,"TITLE-> ");
  poVar1 = std::operator<<(poVar1,(string *)&this->fName);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(out,"Number of nodes       = ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(out,"Number of elements    = ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1,"\n");
  std::operator<<(out,"\n\tGeometric Node Information:\n");
  lVar4 = (this->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>.fNElements;
  lVar3 = 0;
  if (lVar4 < 1) {
    lVar4 = lVar3;
  }
  for (; lVar4 != lVar3; lVar3 = lVar3 + 1) {
    this_00 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                        (&(this->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,lVar3);
    TPZGeoNode::Print(this_00,out);
  }
  std::operator<<(out,"\n\tGeometric Element Information:\n");
  lVar4 = (this->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  lVar3 = 0;
  if (lVar4 < 1) {
    lVar4 = lVar3;
  }
  for (; lVar4 != lVar3; lVar3 = lVar3 + 1) {
    ppTVar2 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                        (&(this->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,lVar3);
    if (*ppTVar2 != (TPZGeoEl *)0x0) {
      ppTVar2 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(this->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,lVar3);
      (**(code **)(*(long *)*ppTVar2 + 0x1a8))(*ppTVar2,out);
    }
    std::operator<<(out,"\n");
  }
  return;
}

Assistant:

void TPZGeoMesh::PrintTopologicalInfo(std::ostream & out) const
{
	out << "TITLE-> " << fName << "\n";
	out << "Number of nodes       = " << fNodeVec.NElements() << "\n";
	out << "Number of elements    = " << fElementVec.NElements()-fElementVec.NFreeElements() << "\n";
	
	out << "\n\tGeometric Node Information:\n";
	int64_t i;
	int64_t nnodes = fNodeVec.NElements();
	for(i=0; i<nnodes; i++)
	{
		fNodeVec[i].Print(out);
	}
	out << "\n\tGeometric Element Information:\n";
	int64_t nelem = fElementVec.NElements();
	for(i=0; i<nelem; i++)
	{
		if(fElementVec[i]) fElementVec[i]->PrintTopologicalInfo(out);
		out << "\n";
	}
}